

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale_data.cpp
# Opt level: O1

void __thiscall
booster::locale::util::locale_data::parse_from_country(locale_data *this,string *locale_name)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  string tmp;
  string local_60;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  uVar3 = std::__cxx11::string::find_first_of((char *)locale_name,0x1ad03b,0);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)locale_name);
  if (local_38 != 0) {
    if (local_38 != 0) {
      uVar2 = 1;
      uVar4 = 0;
      do {
        if ((byte)(local_40[uVar4] + 0x9f) < 0x1a) {
          local_40[uVar4] = local_40[uVar4] + -0x20;
        }
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar4 < local_38);
    }
    std::__cxx11::string::_M_assign((string *)&this->country);
    if (uVar3 < locale_name->_M_string_length) {
      cVar1 = (locale_name->_M_dataplus)._M_p[uVar3];
      if (cVar1 == '@') {
        std::__cxx11::string::substr((ulong)&local_60,(ulong)locale_name);
        parse_from_variant(this,&local_60);
      }
      else {
        if (cVar1 != '.') goto LAB_0017df7e;
        std::__cxx11::string::substr((ulong)&local_60,(ulong)locale_name);
        parse_from_encoding(this,&local_60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
LAB_0017df7e:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void locale_data::parse_from_country(std::string const &locale_name) 
    {
        size_t end = locale_name.find_first_of("@.");
        std::string tmp = locale_name.substr(0,end);
        if(tmp.empty())
            return;
        for(unsigned i=0;i<tmp.size();i++) {
            if('a' <= tmp[i] && tmp[i]<='z')
                tmp[i]=tmp[i]-'a'+'A';
            else if(tmp[i] < 'A' && 'Z' < tmp[i])
                return;
        }

        country = tmp;

        if(end >= locale_name.size())
            return;
        else if(locale_name[end] == '.') {
           parse_from_encoding(locale_name.substr(end+1));
        }
        else if(locale_name[end] == '@') {
           parse_from_variant(locale_name.substr(end+1));
        }
    }